

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

UChar * res_getString_63(ResourceData *pResData,Resource res,int32_t *pLength)

{
  uint uVar1;
  anon_struct_8_3_a62c8074 *local_48;
  int32_t *p32;
  uint local_30;
  int32_t first;
  int32_t length;
  uint32_t offset;
  UChar *p;
  int32_t *pLength_local;
  Resource res_local;
  ResourceData *pResData_local;
  
  uVar1 = res & 0xfffffff;
  if (res >> 0x1c == 6) {
    if ((int)uVar1 < pResData->poolStringIndexLimit) {
      _length = (UChar *)(pResData->poolBundleStrings + uVar1);
    }
    else {
      _length = (UChar *)(pResData->p16BitUnits + (uVar1 - pResData->poolStringIndexLimit));
    }
    local_30 = (uint)(ushort)*_length;
    if ((local_30 & 0xfffffc00) == 0xdc00) {
      if (local_30 < 0xdfef) {
        local_30 = local_30 & 0x3ff;
        _length = _length + 1;
      }
      else if (local_30 < 0xdfff) {
        local_30 = (local_30 - 0xdfef) * 0x10000 | (uint)(ushort)_length[1];
        _length = _length + 2;
      }
      else {
        local_30 = CONCAT22(_length[1],_length[2]);
        _length = _length + 3;
      }
    }
    else {
      local_30 = u_strlen_63(_length);
    }
  }
  else if (res == uVar1) {
    if (res == 0) {
      local_48 = &gEmptyString;
    }
    else {
      local_48 = (anon_struct_8_3_a62c8074 *)(pResData->pRoot + res);
    }
    _length = &local_48->nul;
    local_30 = local_48->length;
  }
  else {
    _length = (UChar *)0x0;
    local_30 = 0;
  }
  if (pLength != (int32_t *)0x0) {
    *pLength = local_30;
  }
  return _length;
}

Assistant:

U_CAPI const UChar * U_EXPORT2
res_getString(const ResourceData *pResData, Resource res, int32_t *pLength) {
    const UChar *p;
    uint32_t offset=RES_GET_OFFSET(res);
    int32_t length;
    if(RES_GET_TYPE(res)==URES_STRING_V2) {
        int32_t first;
        if((int32_t)offset<pResData->poolStringIndexLimit) {
            p=(const UChar *)pResData->poolBundleStrings+offset;
        } else {
            p=(const UChar *)pResData->p16BitUnits+(offset-pResData->poolStringIndexLimit);
        }
        first=*p;
        if(!U16_IS_TRAIL(first)) {
            length=u_strlen(p);
        } else if(first<0xdfef) {
            length=first&0x3ff;
            ++p;
        } else if(first<0xdfff) {
            length=((first-0xdfef)<<16)|p[1];
            p+=2;
        } else {
            length=((int32_t)p[1]<<16)|p[2];
            p+=3;
        }
    } else if(res==offset) /* RES_GET_TYPE(res)==URES_STRING */ {
        const int32_t *p32= res==0 ? &gEmptyString.length : pResData->pRoot+res;
        length=*p32++;
        p=(const UChar *)p32;
    } else {
        p=NULL;
        length=0;
    }
    if(pLength) {
        *pLength=length;
    }
    return p;
}